

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O3

Wlc_Ntk_t * Wlc_NtkGraftMulti(Wlc_Ntk_t *p,int fVerbose)

{
  Wlc_Obj_t *pWlcObj;
  uint uVar1;
  uint uVar2;
  int iVar3;
  Wlc_Obj_t *pWVar4;
  word **__ptr;
  int iVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *__ptr_00;
  Gia_Man_t *p_00;
  Vec_Mem_t *p_01;
  Vec_Wrd_t *pVVar7;
  word *pwVar8;
  ulong uVar9;
  word wVar10;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  char *__s;
  uint uVar16;
  Vec_Int_t *__ptr_01;
  uint uVar17;
  int nMultiRHS;
  int nMultiLHS;
  int local_48;
  int local_44;
  word *local_40;
  Vec_Int_t *local_38;
  
  pVVar6 = Wlc_NtkCollectObjs(p,0,&local_44);
  __ptr_00 = Wlc_NtkCollectObjs(p,1,&local_48);
  p_00 = Wlc_NtkBitBlast(p,(Wlc_BstPar_t *)0x0);
  p_01 = (Vec_Mem_t *)calloc(1,0x30);
  p_01->nEntrySize = 4;
  p_01->LogPageSze = 10;
  p_01->PageMask = 0x3ff;
  p_01->iPage = -1;
  Vec_MemHashAlloc(p_01,10000);
  iVar13 = local_44;
  if (local_44 == 0 && local_48 == 0) {
    __s = "No multipliers are present.";
LAB_0035c0a9:
    puts(__s);
    return (Wlc_Ntk_t *)0x0;
  }
  if (0 < local_48 && 0 < local_44) {
    __s = "Multipliers are present in both sides of the miter.";
    goto LAB_0035c0a9;
  }
  if (local_48 < 1) {
    __ptr_01 = pVVar6;
    if (local_44 < 1) {
      __assert_fail("nMultiLHS > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                    ,0xeb,"Wlc_Ntk_t *Wlc_NtkGraftMulti(Wlc_Ntk_t *, int)");
    }
  }
  else {
    local_44 = local_48;
    local_48 = iVar13;
    __ptr_01 = __ptr_00;
    __ptr_00 = pVVar6;
  }
  if (local_48 != 0) {
    __assert_fail("nMultiRHS == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                  ,0xec,"Wlc_Ntk_t *Wlc_NtkGraftMulti(Wlc_Ntk_t *, int)");
  }
  pVVar7 = p_00->vSims;
  if (pVVar7 != (Vec_Wrd_t *)0x0) {
    if (pVVar7->pArray != (word *)0x0) {
      free(pVVar7->pArray);
      p_00->vSims->pArray = (word *)0x0;
      pVVar7 = p_00->vSims;
      if (pVVar7 == (Vec_Wrd_t *)0x0) goto LAB_0035c119;
    }
    free(pVVar7);
  }
LAB_0035c119:
  iVar13 = p_00->nObjs;
  pVVar7 = (Vec_Wrd_t *)malloc(0x10);
  iVar3 = (int)((long)iVar13 << 2);
  iVar5 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar5 = iVar3;
  }
  pVVar7->nCap = iVar5;
  if (iVar5 == 0) {
    pwVar8 = (word *)0x0;
  }
  else {
    pwVar8 = (word *)malloc((long)iVar5 << 3);
  }
  pVVar7->pArray = pwVar8;
  pVVar7->nSize = iVar3;
  memset(pwVar8,0,(long)iVar13 << 5);
  p_00->vSims = pVVar7;
  p_00->nSimWords = 4;
  Gia_ManRandomW(1);
  if (1 < p_00->nObjs) {
    lVar14 = 1;
    local_38 = __ptr_01;
    do {
      uVar17 = (uint)*(ulong *)(p_00->pObjs + lVar14);
      uVar9 = *(ulong *)(p_00->pObjs + lVar14) & 0x1fffffff;
      iVar13 = (int)lVar14;
      if (uVar9 == 0x1fffffff || (int)uVar17 < 0) {
        if ((int)uVar17 < 0 && (int)uVar9 != 0x1fffffff) {
          uVar1 = p_00->nSimWords;
          if ((int)(uVar1 * iVar13) < 0) goto LAB_0035c616;
          uVar2 = p_00->vSims->nSize;
          if ((int)uVar2 <= (int)(uVar1 * iVar13)) goto LAB_0035c616;
          uVar12 = uVar17 & 0x1fffffff;
          uVar16 = (iVar13 - uVar12) * uVar1;
          if (((int)uVar16 < 0) || (uVar2 <= uVar16)) goto LAB_0035c616;
          pwVar8 = p_00->vSims->pArray;
          if ((uVar17 >> 0x1d & 1) == 0) {
            if (0 < (int)uVar1) {
              uVar9 = 0;
              do {
                pwVar8[uVar1 * iVar13 + uVar9] = pwVar8[(iVar13 - uVar12) * uVar1 + uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar1 != uVar9);
            }
          }
          else if (0 < (int)uVar1) {
            uVar9 = 0;
            do {
              pwVar8[uVar1 * iVar13 + uVar9] = ~pwVar8[(iVar13 - uVar12) * uVar1 + uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar1 != uVar9);
          }
        }
        else {
          if ((~uVar17 & 0x9fffffff) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                          ,0xfc,"Wlc_Ntk_t *Wlc_NtkGraftMulti(Wlc_Ntk_t *, int)");
          }
          iVar3 = p_00->nSimWords;
          uVar17 = iVar13 * iVar3;
          if (((int)uVar17 < 0) || (p_00->vSims->nSize <= (int)uVar17)) goto LAB_0035c616;
          pwVar8 = p_00->vSims->pArray;
          local_40 = pwVar8;
          if (0 < iVar3) {
            lVar15 = 0;
            do {
              wVar10 = Gia_ManRandomW(0);
              pwVar8[(ulong)(uint)(iVar3 * iVar13) + lVar15] = wVar10;
              lVar15 = lVar15 + 1;
            } while (lVar15 < p_00->nSimWords);
          }
          local_40[uVar17] = local_40[uVar17] << 1;
          __ptr_01 = local_38;
        }
      }
      else {
        Wlc_ObjSimAnd(p_00,iVar13);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < p_00->nObjs);
  }
  if (p_00->vSims->nSize < 1) {
LAB_0035c616:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                  ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
  }
  Vec_MemHashInsert(p_01,p_00->vSims->pArray);
  iVar13 = __ptr_01->nSize;
  if (0 < iVar13) {
    lVar14 = 0;
    do {
      lVar15 = (long)__ptr_01->pArray[lVar14];
      if ((lVar15 < 1) || (p->nObjsAlloc <= __ptr_01->pArray[lVar14])) goto LAB_0035c5f7;
      pWVar4 = p->pObjs;
      if ((undefined1  [24])((undefined1  [24])pWVar4[lVar15] & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x2d) {
        pWlcObj = pWVar4 + lVar15;
        paVar11 = &pWlcObj->field_10;
        if (2 < pWlcObj->nFanins) {
          paVar11 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar11->pFanins[0];
        }
        uVar17 = paVar11->Fanins[0];
        if (((long)(int)uVar17 < 1) || ((uint)p->nObjsAlloc <= uVar17)) goto LAB_0035c5f7;
        Wlc_NtkSaveOneNode(p,pWVar4 + (int)uVar17,p_00,p_01);
        if ((pWlcObj->nFanins < 3) && ((*(uint *)pWlcObj & 0x3f | 0x10) != 0x16)) {
          paVar11 = &pWlcObj->field_10;
        }
        else {
          paVar11 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWlcObj->field_10).pFanins[0];
        }
        iVar13 = paVar11->Fanins[1];
        if (((long)iVar13 < 1) || (p->nObjsAlloc <= iVar13)) goto LAB_0035c5f7;
        Wlc_NtkSaveOneNode(p,p->pObjs + iVar13,p_00,p_01);
        Wlc_NtkSaveOneNode(p,pWlcObj,p_00,p_01);
        iVar13 = __ptr_01->nSize;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar13);
  }
  if (0 < __ptr_00->nSize) {
    lVar14 = 0;
    do {
      iVar13 = __ptr_00->pArray[lVar14];
      if (((long)iVar13 < 1) || (p->nObjsAlloc <= iVar13)) {
LAB_0035c5f7:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      Wlc_NtkFindOneNode(p,p->pObjs + iVar13,p_00,p_01);
      lVar14 = lVar14 + 1;
    } while (lVar14 < __ptr_00->nSize);
  }
  pVVar6 = p_01->vTable;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
    }
    free(pVVar6);
  }
  pVVar6 = p_01->vNexts;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
    }
    free(pVVar6);
  }
  uVar17 = p_01->iPage;
  __ptr = p_01->ppPages;
  if ((int)uVar17 < 0) {
    if (__ptr != (word **)0x0) goto LAB_0035c549;
  }
  else {
    lVar14 = 0;
    do {
      if (__ptr[lVar14] != (word *)0x0) {
        free(__ptr[lVar14]);
        __ptr[lVar14] = (word *)0x0;
      }
      lVar14 = lVar14 + 1;
    } while ((ulong)uVar17 + 1 != lVar14);
LAB_0035c549:
    free(__ptr);
  }
  free(p_01);
  pVVar7 = p_00->vSims;
  if (pVVar7 != (Vec_Wrd_t *)0x0) {
    if (pVVar7->pArray != (word *)0x0) {
      free(pVVar7->pArray);
      p_00->vSims->pArray = (word *)0x0;
      pVVar7 = p_00->vSims;
      if (pVVar7 == (Vec_Wrd_t *)0x0) goto LAB_0035c5a2;
    }
    free(pVVar7);
    p_00->vSims = (Vec_Wrd_t *)0x0;
  }
LAB_0035c5a2:
  p_00->nSimWords = 0;
  if (__ptr_01->pArray != (int *)0x0) {
    free(__ptr_01->pArray);
  }
  free(__ptr_01);
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  Gia_ManStop(p_00);
  return (Wlc_Ntk_t *)0x0;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkGraftMulti( Wlc_Ntk_t * p, int fVerbose )
{
    int nWords = 4;
    int i, nMultiLHS, nMultiRHS;
    word * pInfoObj;
    Wlc_Ntk_t * pNew = NULL;
    Wlc_Obj_t * pWlcObj;
    Gia_Obj_t * pObj;
    Vec_Int_t * vObjsLHS = Wlc_NtkCollectObjs( p, 0, &nMultiLHS );
    Vec_Int_t * vObjsRHS = Wlc_NtkCollectObjs( p, 1, &nMultiRHS );
    Gia_Man_t * pGia = Wlc_NtkBitBlast( p, NULL ); //, -1, 0, 0, 0, 0, 1, 0, 0 ); // <= no cleanup
    Vec_Mem_t * vTtMem = Vec_MemAlloc( nWords, 10 );
    Vec_MemHashAlloc( vTtMem, 10000 );

    // check if there are multipliers
    if ( nMultiLHS == 0 && nMultiRHS == 0 )
    {
        printf( "No multipliers are present.\n" );
        return NULL;
    }
    // compare multipliers
    if ( nMultiLHS > 0 && nMultiRHS > 0 )
    {
        printf( "Multipliers are present in both sides of the miter.\n" );
        return NULL;
    }
    // swap if wrong side
    if ( nMultiRHS > 0 )
    {
        ABC_SWAP( Vec_Int_t *, vObjsLHS, vObjsRHS );
        ABC_SWAP( int, nMultiLHS, nMultiRHS );
    }
    assert( nMultiLHS > 0 );
    assert( nMultiRHS == 0 );

    // allocate simulation info for one timeframe
    Vec_WrdFreeP( &pGia->vSims );
    pGia->vSims = Vec_WrdStart( Gia_ManObjNum(pGia) * nWords );
    pGia->nSimWords = nWords;
    // perform simulation
    Gia_ManRandomW( 1 );
    Gia_ManForEachObj1( pGia, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Wlc_ObjSimAnd( pGia, i );
        else if ( Gia_ObjIsCo(pObj) )
            Wlc_ObjSimCo( pGia, i );
        else if ( Gia_ObjIsCi(pObj) )
            Wlc_ObjSimPi( pGia, i );
        else assert( 0 );
    }

    // hash constant 0
    pInfoObj = Wlc_ObjSim( pGia, 0 );
    Vec_MemHashInsert( vTtMem, pInfoObj );

    // hash sim info on the multiplier boundary
    Wlc_NtkForEachObjVec( vObjsLHS, p, pWlcObj, i )
        if ( Wlc_ObjType(pWlcObj) == WLC_OBJ_ARI_MULTI )
        {
            Wlc_NtkSaveOneNode( p, Wlc_ObjFanin0(p, pWlcObj), pGia, vTtMem );
            Wlc_NtkSaveOneNode( p, Wlc_ObjFanin1(p, pWlcObj), pGia, vTtMem );
            Wlc_NtkSaveOneNode( p, pWlcObj, pGia, vTtMem );
        }

    // check if there are similar signals in LHS
    Wlc_NtkForEachObjVec( vObjsRHS, p, pWlcObj, i )
        Wlc_NtkFindOneNode( p, pWlcObj, pGia, vTtMem );

    // perform grafting


    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );

    // cleanup
    Vec_WrdFreeP( &pGia->vSims );
    pGia->nSimWords = 0;

    Vec_IntFree( vObjsLHS );
    Vec_IntFree( vObjsRHS );
    Gia_ManStop( pGia );
    return pNew;
}